

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

void Abc_NtkDfsWithBoxes_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  void **ppvVar5;
  int in_EDX;
  int Fill;
  Abc_Obj_t *pNode_00;
  int iVar6;
  long lVar7;
  
  uVar4 = *(uint *)&pNode->field_0x14 & 0xf;
  if (uVar4 == 5) {
    pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
  }
  else if (uVar4 == 6) {
    __assert_fail("!Abc_ObjIsNet(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x30d,"void Abc_NtkDfsWithBoxes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  uVar4 = *(uint *)&pNode->field_0x14 & 0xf;
  if (uVar4 == 2) {
    return;
  }
  if ((uVar4 != 7) && (uVar4 != 10 && (*(uint *)&pNode->field_0x14 & 0xe) != 8)) {
    __assert_fail("Abc_ObjIsNode( pNode ) || Abc_ObjIsBox( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x312,"void Abc_NtkDfsWithBoxes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  pAVar2 = pNode->pNtk;
  iVar6 = pNode->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,in_EDX);
  if (((long)iVar6 < 0) || ((pAVar2->vTravIds).nSize <= iVar6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar3 = pNode->pNtk;
  iVar1 = pAVar3->nTravIds;
  if ((pAVar2->vTravIds).pArray[iVar6] == iVar1) {
    return;
  }
  iVar6 = pNode->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar6 + 1,Fill);
  if (((long)iVar6 < 0) || ((pAVar3->vTravIds).nSize <= iVar6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar3->vTravIds).pArray[iVar6] = iVar1;
  if (0 < (pNode->vFanins).nSize) {
    lVar7 = 0;
    do {
      pNode_00 = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar7]];
      if ((*(uint *)&pNode->field_0x14 & 0xe) == 8 || (*(uint *)&pNode->field_0x14 & 0xf) == 10) {
        pNode_00 = (Abc_Obj_t *)pNode_00->pNtk->vObjs->pArray[*(pNode_00->vFanins).pArray];
      }
      if ((*(uint *)&pNode_00->field_0x14 & 0xf) != 6) {
        __assert_fail("Abc_ObjIsNet(pFanin)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                      ,0x31a,"void Abc_NtkDfsWithBoxes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
      }
      if (pNode_00->pNtk->ntkType == ABC_NTK_NETLIST) {
        pNode_00 = (Abc_Obj_t *)pNode_00->pNtk->vObjs->pArray[*(pNode_00->vFanins).pArray];
      }
      Abc_NtkDfsWithBoxes_rec(pNode_00,vNodes);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (pNode->vFanins).nSize);
  }
  uVar4 = vNodes->nCap;
  if (vNodes->nSize == uVar4) {
    if ((int)uVar4 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar5;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar4 * 2;
      if (iVar6 <= (int)uVar4) goto LAB_0084d535;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar4 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vNodes->pArray,(ulong)uVar4 << 4);
      }
      vNodes->pArray = ppvVar5;
    }
    vNodes->nCap = iVar6;
  }
LAB_0084d535:
  iVar6 = vNodes->nSize;
  vNodes->nSize = iVar6 + 1;
  vNodes->pArray[iVar6] = pNode;
  return;
}

Assistant:

void Abc_NtkDfsWithBoxes_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    assert( !Abc_ObjIsNet(pNode) );
    if ( Abc_ObjIsBo(pNode) )
        pNode = Abc_ObjFanin0(pNode);
    if ( Abc_ObjIsPi(pNode) )
        return;
    assert( Abc_ObjIsNode( pNode ) || Abc_ObjIsBox( pNode ) );
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( Abc_ObjIsBox(pNode) )
            pFanin = Abc_ObjFanin0(pFanin);
        assert( Abc_ObjIsNet(pFanin) );
        Abc_NtkDfsWithBoxes_rec( Abc_ObjFanin0Ntk(pFanin), vNodes );
    }
    Vec_PtrPush( vNodes, pNode );
}